

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall cs_impl::any::recycle(any *this)

{
  size_t *psVar1;
  proxy *__ptr;
  
  __ptr = this->mDat;
  if (__ptr != (proxy *)0x0) {
    psVar1 = &__ptr->refcount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      cs::allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider>::free
                ((allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *)
                 allocator,__ptr);
      this->mDat = (proxy *)0x0;
    }
  }
  return;
}

Assistant:

void recycle() noexcept
		{
			if (mDat != nullptr) {
				--mDat->refcount;
				if (mDat->refcount == 0) {
					allocator.free(mDat);
					mDat = nullptr;
				}
			}
		}